

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall
miniros::Subscription::pendingConnectionDone
          (Subscription *this,PendingConnectionPtr *conn,XmlRpcValue *result)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  XmlRpcClient *pXVar5;
  string *psVar6;
  ostream *poVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Type *pTVar10;
  XmlRpcValue *pXVar11;
  TransportPublisherLink *this_00;
  uint *puVar12;
  element_type *this_01;
  element_type *this_02;
  int *piVar13;
  size_type sVar14;
  element_type *__dest;
  reference __src;
  socklen_t __len;
  long in_RDI;
  bool enabled_14;
  bool enabled_13;
  bool enabled_12;
  scoped_lock<std::mutex> lock_2;
  ConnectionPtr connection_1;
  TransportPublisherLinkPtr pub_link_1;
  bool enabled_11;
  string error_msg;
  bool enabled_10;
  bool enabled_9;
  string err;
  Header h;
  shared_ptr<unsigned_char[]> buffer;
  vector<char,_std::allocator<char>_> header_bytes;
  int max_datagram_size;
  int conn_id;
  int pub_port_1;
  string pub_host_1;
  bool enabled_8;
  bool enabled_7;
  bool enabled_6;
  scoped_lock<std::mutex> lock_1;
  TransportPublisherLinkPtr pub_link;
  ConnectionPtr connection;
  TransportTCPPtr transport;
  bool enabled_5;
  int pub_port;
  string pub_host;
  bool enabled_4;
  string proto_name;
  bool enabled_3;
  bool enabled_2;
  bool enabled_1;
  bool enabled;
  XmlRpcValue proto;
  string xmlrpc_uri;
  stringstream ss;
  uint32_t peer_port;
  string peer_host;
  TransportUDPPtr udp_transport;
  scoped_lock<std::mutex> pending_connections_lock;
  scoped_lock<std::mutex> lock;
  char *in_stack_fffffffffffff508;
  Subscription *in_stack_fffffffffffff510;
  shared_array_uint8_t *in_stack_fffffffffffff518;
  undefined4 uVar15;
  LogLocation *in_stack_fffffffffffff520;
  int in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff52c;
  int in_stack_fffffffffffff530;
  Level in_stack_fffffffffffff534;
  TransportHints *in_stack_fffffffffffff538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff540;
  void *pvVar16;
  undefined4 in_stack_fffffffffffff548;
  Level LVar17;
  undefined4 in_stack_fffffffffffff54c;
  ConnectionManager *in_stack_fffffffffffff550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  XmlRpcValue *in_stack_fffffffffffff558;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff560;
  HeaderReceivedFunc *in_stack_fffffffffffff5f8;
  HeaderReceivedFunc *header_func;
  undefined8 in_stack_fffffffffffff600;
  undefined1 is_server;
  Subscription *pSVar18;
  TransportPtr *in_stack_fffffffffffff608;
  Level in_stack_fffffffffffff610;
  uint in_stack_fffffffffffff614;
  undefined7 in_stack_fffffffffffff6b8;
  undefined1 in_stack_fffffffffffff6bf;
  XmlRpcValue *in_stack_fffffffffffff6f0;
  XmlRpcValue *in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff700;
  RPCManager *in_stack_fffffffffffff708;
  ConnectionPtr *in_stack_fffffffffffff7d0;
  TransportPublisherLink *in_stack_fffffffffffff7d8;
  undefined1 local_6d9 [39];
  undefined1 local_6b2;
  allocator<char> local_6b1;
  string local_6b0 [38];
  undefined1 local_68a;
  allocator<char> local_689;
  string local_688 [158];
  undefined1 local_5ea;
  allocator<char> local_5e9;
  string local_5e8 [39];
  undefined1 local_5c1 [33];
  string local_5a0 [38];
  char local_57a;
  allocator<char> local_579;
  string local_578 [38];
  undefined1 local_552;
  allocator<char> local_551;
  string local_550 [32];
  string local_530 [48];
  __shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> local_500;
  vector<char,_std::allocator<char>_> local_4f0;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  string local_4c8 [38];
  undefined1 local_4a2;
  allocator<char> local_4a1;
  string local_4a0 [38];
  undefined1 local_47a;
  allocator<char> local_479;
  string local_478 [38];
  undefined1 local_452;
  allocator<char> local_451;
  string local_450 [152];
  PollSet *local_3b8;
  undefined1 local_39a;
  allocator<char> local_399;
  string local_398 [36];
  uint local_374;
  string local_370 [38];
  undefined1 local_34a;
  allocator<char> local_349;
  string local_348 [32];
  string local_328 [38];
  undefined1 local_302;
  allocator<char> local_301;
  string local_300 [38];
  undefined1 local_2da;
  allocator<char> local_2d9;
  string local_2d8 [38];
  undefined1 local_2b2;
  allocator<char> local_2b1;
  string local_2b0 [38];
  undefined1 local_28a;
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  string local_260 [32];
  XmlRpcValue local_240 [2];
  string local_220 [32];
  stringstream local_200 [16];
  ostream local_1f0 [380];
  uint local_74;
  string local_70 [76];
  int local_24;
  
  is_server = (undefined1)((ulong)in_stack_fffffffffffff600 >> 0x38);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffff510,
             (mutex_type *)in_stack_fffffffffffff508);
  if (((*(byte *)(in_RDI + 0xe5) & 1) != 0) || ((*(byte *)(in_RDI + 0xe4) & 1) != 0)) {
    local_24 = 1;
    goto LAB_004d63fa;
  }
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffff510,
             (mutex_type *)in_stack_fffffffffffff508);
  std::
  set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
  ::erase((set<std::shared_ptr<miniros::Subscription::PendingConnection>,_std::less<std::shared_ptr<miniros::Subscription::PendingConnection>_>,_std::allocator<std::shared_ptr<miniros::Subscription::PendingConnection>_>_>
           *)in_stack_fffffffffffff510,(key_type *)in_stack_fffffffffffff508);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d354e);
  std::shared_ptr<miniros::TransportUDP>::shared_ptr((shared_ptr<miniros::TransportUDP> *)0x4d355b);
  peVar4 = std::
           __shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4d3568);
  pXVar5 = PendingConnection::getClient(peVar4);
  psVar6 = XmlRpc::XmlRpcClient::getHost_abi_cxx11_(pXVar5);
  std::__cxx11::string::string(local_70,(string *)psVar6);
  peVar4 = std::
           __shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4d35b5);
  pXVar5 = PendingConnection::getClient(peVar4);
  local_74 = XmlRpc::XmlRpcClient::getPort(pXVar5);
  std::__cxx11::stringstream::stringstream(local_200);
  poVar7 = std::operator<<(local_1f0,"http://");
  poVar7 = std::operator<<(poVar7,local_70);
  poVar7 = std::operator<<(poVar7,":");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_74);
  std::operator<<(poVar7,"/");
  std::__cxx11::stringstream::str();
  std::
  __shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<miniros::Subscription::PendingConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x4d36ad);
  PendingConnection::getUDPTransport((PendingConnection *)in_stack_fffffffffffff508);
  std::shared_ptr<miniros::TransportUDP>::operator=
            ((shared_ptr<miniros::TransportUDP> *)in_stack_fffffffffffff510,
             (shared_ptr<miniros::TransportUDP> *)in_stack_fffffffffffff508);
  std::shared_ptr<miniros::TransportUDP>::~shared_ptr((shared_ptr<miniros::TransportUDP> *)0x4d36e9)
  ;
  XmlRpc::XmlRpcValue::XmlRpcValue(local_240);
  RPCManager::instance();
  std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4d3714);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff550,
             (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
             (allocator<char> *)in_stack_fffffffffffff540);
  __len = (socklen_t)local_240;
  bVar1 = RPCManager::validateXmlrpcResponse
                    (in_stack_fffffffffffff708,in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
                     in_stack_fffffffffffff6f0);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar2 = XmlRpc::XmlRpcValue::size(in_stack_fffffffffffff558);
    if (iVar2 == 0) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
      if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff550,
                   (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                   (allocator<char> *)in_stack_fffffffffffff540);
        console::initializeLogLocation
                  ((LogLocation *)in_stack_fffffffffffff540,(string *)in_stack_fffffffffffff538,
                   in_stack_fffffffffffff534);
        std::__cxx11::string::~string(local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
      }
      if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
        console::checkLogLocationEnabled(in_stack_fffffffffffff520);
      }
      pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.logger_;
      LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
               ::loc.level_;
      local_2b2 = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                   ::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_2b2) {
        uVar8 = std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                       ,0x1dc,
                       "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                       ,"Couldn\'t agree on any common protocols with [%s] for topic [%s]",uVar8,
                       uVar9);
      }
      closeTransport((TransportUDPPtr *)0x4d3ce6);
      local_24 = 1;
    }
    else {
      pTVar10 = XmlRpc::XmlRpcValue::getType(local_240);
      if (*pTVar10 == TypeArray) {
        pXVar11 = XmlRpc::XmlRpcValue::operator[]
                            ((XmlRpcValue *)in_stack_fffffffffffff510,
                             (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
        pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
        if (*pTVar10 == TypeString) {
          XmlRpc::XmlRpcValue::operator[]
                    ((XmlRpcValue *)in_stack_fffffffffffff510,
                     (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
          psVar6 = XmlRpc::XmlRpcValue::operator_cast_to_string_
                             ((XmlRpcValue *)in_stack_fffffffffffff510);
          std::__cxx11::string::string(local_328,(string *)psVar6);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
          if (bVar1) {
            iVar2 = XmlRpc::XmlRpcValue::size(in_stack_fffffffffffff558);
            if (iVar2 == 3) {
              pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                  ((XmlRpcValue *)in_stack_fffffffffffff510,
                                   (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
              pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
              if (*pTVar10 == TypeString) {
                pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                    ((XmlRpcValue *)in_stack_fffffffffffff510,
                                     (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
                if (*pTVar10 == TypeInt) {
                  this_00 = (TransportPublisherLink *)
                            XmlRpc::XmlRpcValue::operator[]
                                      ((XmlRpcValue *)in_stack_fffffffffffff510,
                                       (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                  psVar6 = XmlRpc::XmlRpcValue::operator_cast_to_string_
                                     ((XmlRpcValue *)in_stack_fffffffffffff510);
                  std::__cxx11::string::string(local_370,(string *)psVar6);
                  XmlRpc::XmlRpcValue::operator[]
                            ((XmlRpcValue *)in_stack_fffffffffffff510,
                             (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                  puVar12 = (uint *)XmlRpc::XmlRpcValue::operator_cast_to_int_
                                              ((XmlRpcValue *)in_stack_fffffffffffff510);
                  local_374 = *puVar12;
                  if (((console::g_initialized ^ 0xff) & 1) != 0) {
                    console::initialize();
                  }
                  if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff550,
                               (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548)
                               ,(allocator<char> *)in_stack_fffffffffffff540);
                    console::initializeLogLocation
                              ((LogLocation *)in_stack_fffffffffffff540,
                               (string *)in_stack_fffffffffffff538,in_stack_fffffffffffff534);
                    std::__cxx11::string::~string(local_398);
                    std::allocator<char>::~allocator(&local_399);
                  }
                  if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                      ::loc.level_ != Debug) {
                    console::setLogLocationLevel
                              ((LogLocation *)in_stack_fffffffffffff510,
                               (Level)((ulong)in_stack_fffffffffffff508 >> 0x20));
                    console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                  }
                  pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                            ::loc.logger_;
                  LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.level_;
                  local_39a = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                               ::loc.logger_enabled_ & 1U) != 0;
                  if ((bool)local_39a) {
                    in_stack_fffffffffffff510 = (Subscription *)std::__cxx11::string::c_str();
                    uVar15 = (undefined4)((ulong)in_stack_fffffffffffff520 >> 0x20);
                    uVar8 = std::__cxx11::string::c_str();
                    in_stack_fffffffffffff520 = (LogLocation *)CONCAT44(uVar15,local_374);
                    in_stack_fffffffffffff508 =
                         "Connecting via tcpros to topic [%s] at host [%s:%d]";
                    __len = 0x57c99d;
                    console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                   ,0x1fb,
                                   "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                   ,"Connecting via tcpros to topic [%s] at host [%s:%d]",
                                   in_stack_fffffffffffff510,uVar8);
                  }
                  PollManager::instance();
                  this_01 = std::
                            __shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x4d4648);
                  local_3b8 = PollManager::getPollSet(this_01);
                  std::make_shared<miniros::TransportTCP,miniros::PollSet*>
                            ((PollSet **)in_stack_fffffffffffff538);
                  this_02 = std::
                            __shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x4d468e);
                  uVar3 = TransportTCP::connect
                                    (this_02,(int)local_370,(sockaddr *)(ulong)local_374,__len);
                  if ((uVar3 & 1) == 0) {
                    if (((console::g_initialized ^ 0xff) & 1) != 0) {
                      console::initialize();
                    }
                    LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
                    if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff550,
                                 (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                  in_stack_fffffffffffff548),
                                 (allocator<char> *)in_stack_fffffffffffff540);
                      console::initializeLogLocation
                                ((LogLocation *)in_stack_fffffffffffff540,
                                 (string *)in_stack_fffffffffffff538,in_stack_fffffffffffff534);
                      std::__cxx11::string::~string(local_478);
                      std::allocator<char>::~allocator(&local_479);
                    }
                    if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc.level_ != Debug) {
                      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
                      console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                    }
                    pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc.logger_;
                    LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.level_;
                    uVar15 = (undefined4)((ulong)in_stack_fffffffffffff520 >> 0x20);
                    local_47a = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.logger_enabled_ & 1U) != 0;
                    if ((bool)local_47a) {
                      uVar8 = std::__cxx11::string::c_str();
                      uVar9 = std::__cxx11::string::c_str();
                      console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                     ,0x20f,
                                     "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                     ,"Failed to connect to publisher of topic [%s] at [%s:%d]",
                                     uVar8,uVar9,CONCAT44(uVar15,local_374));
                    }
                  }
                  else {
                    std::make_shared<miniros::Connection>();
                    std::enable_shared_from_this<miniros::Subscription>::shared_from_this
                              ((enable_shared_from_this<miniros::Subscription> *)
                               in_stack_fffffffffffff508);
                    std::
                    make_shared<miniros::TransportPublisherLink,std::shared_ptr<miniros::Subscription>,std::__cxx11::string&,miniros::TransportHints&>
                              ((shared_ptr<miniros::Subscription> *)
                               CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                               in_stack_fffffffffffff540,in_stack_fffffffffffff538);
                    std::shared_ptr<miniros::Subscription>::~shared_ptr
                              ((shared_ptr<miniros::Subscription> *)0x4d4723);
                    std::
                    __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4d4730);
                    std::shared_ptr<miniros::Transport>::shared_ptr<miniros::TransportTCP,void>
                              ((shared_ptr<miniros::Transport> *)in_stack_fffffffffffff510,
                               (shared_ptr<miniros::TransportTCP> *)in_stack_fffffffffffff508);
                    std::
                    function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                    ::function((function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                                *)in_stack_fffffffffffff510);
                    Connection::initialize
                              ((Connection *)
                               CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
                               in_stack_fffffffffffff608,(bool)is_server,in_stack_fffffffffffff5f8);
                    std::
                    function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                    ::~function((function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                                 *)0x4d4798);
                    std::shared_ptr<miniros::Transport>::~shared_ptr
                              ((shared_ptr<miniros::Transport> *)0x4d47a5);
                    std::
                    __shared_ptr_access<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4d47b2);
                    TransportPublisherLink::initialize(this_00,(ConnectionPtr *)psVar6);
                    ConnectionManager::instance();
                    std::
                    __shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x4d47e0);
                    ConnectionManager::addConnection
                              (in_stack_fffffffffffff550,
                               (ConnectionPtr *)
                               CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
                    std::scoped_lock<std::mutex>::scoped_lock
                              ((scoped_lock<std::mutex> *)in_stack_fffffffffffff510,
                               (mutex_type *)in_stack_fffffffffffff508);
                    std::shared_ptr<miniros::PublisherLink>::
                    shared_ptr<miniros::TransportPublisherLink,void>
                              ((shared_ptr<miniros::PublisherLink> *)in_stack_fffffffffffff510,
                               (shared_ptr<miniros::TransportPublisherLink> *)
                               in_stack_fffffffffffff508);
                    addPublisherLink(in_stack_fffffffffffff510,
                                     (PublisherLinkPtr *)in_stack_fffffffffffff508);
                    LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
                    std::shared_ptr<miniros::PublisherLink>::~shared_ptr
                              ((shared_ptr<miniros::PublisherLink> *)0x4d4851);
                    if (((console::g_initialized ^ 0xff) & 1) != 0) {
                      console::initialize();
                    }
                    if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff550,
                                 (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                  in_stack_fffffffffffff548),
                                 (allocator<char> *)in_stack_fffffffffffff540);
                      console::initializeLogLocation
                                ((LogLocation *)in_stack_fffffffffffff540,
                                 (string *)in_stack_fffffffffffff538,in_stack_fffffffffffff534);
                      std::__cxx11::string::~string(local_450);
                      std::allocator<char>::~allocator(&local_451);
                    }
                    if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                        ::loc.level_ != Debug) {
                      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
                      console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                    }
                    pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                              ::loc.logger_;
                    LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.level_;
                    uVar15 = (undefined4)((ulong)in_stack_fffffffffffff520 >> 0x20);
                    local_452 = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.logger_enabled_ & 1U) != 0;
                    if ((bool)local_452) {
                      uVar8 = std::__cxx11::string::c_str();
                      uVar9 = std::__cxx11::string::c_str();
                      console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                     ,0x20b,
                                     "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                     ,"Connected to publisher of topic [%s] at [%s:%d]",uVar8,uVar9,
                                     CONCAT44(uVar15,local_374));
                    }
                    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d4b2e);
                    std::shared_ptr<miniros::TransportPublisherLink>::~shared_ptr
                              ((shared_ptr<miniros::TransportPublisherLink> *)0x4d4b3b);
                    std::shared_ptr<miniros::Connection>::~shared_ptr
                              ((shared_ptr<miniros::Connection> *)0x4d4b48);
                  }
                  std::shared_ptr<miniros::TransportTCP>::~shared_ptr
                            ((shared_ptr<miniros::TransportTCP> *)0x4d4d71);
                  std::__cxx11::string::~string(local_370);
                  goto LAB_004d63a1;
                }
              }
            }
            LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.initialized_ ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff550,
                         (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                         (allocator<char> *)in_stack_fffffffffffff540);
              console::initializeLogLocation
                        ((LogLocation *)in_stack_fffffffffffff540,
                         (string *)in_stack_fffffffffffff538,in_stack_fffffffffffff534);
              std::__cxx11::string::~string(local_348);
              std::allocator<char>::~allocator(&local_349);
            }
            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
              console::checkLogLocationEnabled(in_stack_fffffffffffff520);
            }
            local_34a = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.logger_enabled_ & 1U) != 0;
            if ((bool)local_34a) {
              console::print((FilterBase *)0x0,
                             pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                             ::loc.logger_,
                             (Level)(ulong)pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                           ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                             ,0x1f6,
                             "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                             ,"publisher implements TCPROS, but the parameters aren\'t string,int");
            }
            local_24 = 1;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
            if (bVar1) {
              iVar2 = XmlRpc::XmlRpcValue::size(in_stack_fffffffffffff558);
              if (iVar2 == 6) {
                pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                    ((XmlRpcValue *)in_stack_fffffffffffff510,
                                     (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
                if (*pTVar10 == TypeString) {
                  pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                      ((XmlRpcValue *)in_stack_fffffffffffff510,
                                       (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                  pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
                  if (*pTVar10 == TypeInt) {
                    pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                        ((XmlRpcValue *)in_stack_fffffffffffff510,
                                         (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                    pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
                    if (*pTVar10 == TypeInt) {
                      pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                          ((XmlRpcValue *)in_stack_fffffffffffff510,
                                           (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                      pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
                      if (*pTVar10 == TypeInt) {
                        pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                            ((XmlRpcValue *)in_stack_fffffffffffff510,
                                             (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                        pTVar10 = XmlRpc::XmlRpcValue::getType(pXVar11);
                        if (*pTVar10 == TypeBase64) {
                          pXVar11 = XmlRpc::XmlRpcValue::operator[]
                                              ((XmlRpcValue *)in_stack_fffffffffffff510,
                                               (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                          psVar6 = XmlRpc::XmlRpcValue::operator_cast_to_string_
                                             ((XmlRpcValue *)in_stack_fffffffffffff510);
                          std::__cxx11::string::string(local_4c8,(string *)psVar6);
                          XmlRpc::XmlRpcValue::operator[]
                                    ((XmlRpcValue *)in_stack_fffffffffffff510,
                                     (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                          piVar13 = XmlRpc::XmlRpcValue::operator_cast_to_int_
                                              ((XmlRpcValue *)in_stack_fffffffffffff510);
                          local_4cc = *piVar13;
                          XmlRpc::XmlRpcValue::operator[]
                                    ((XmlRpcValue *)in_stack_fffffffffffff510,
                                     (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                          piVar13 = XmlRpc::XmlRpcValue::operator_cast_to_int_
                                              ((XmlRpcValue *)in_stack_fffffffffffff510);
                          local_4d0 = *piVar13;
                          XmlRpc::XmlRpcValue::operator[]
                                    ((XmlRpcValue *)in_stack_fffffffffffff510,
                                     (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                          piVar13 = XmlRpc::XmlRpcValue::operator_cast_to_int_
                                              ((XmlRpcValue *)in_stack_fffffffffffff510);
                          local_4d4 = *piVar13;
                          XmlRpc::XmlRpcValue::operator[]
                                    ((XmlRpcValue *)in_stack_fffffffffffff510,
                                     (int)((ulong)in_stack_fffffffffffff508 >> 0x20));
                          XmlRpc::XmlRpcValue::operator_cast_to_vector_
                                    ((XmlRpcValue *)in_stack_fffffffffffff510);
                          std::vector<char,_std::allocator<char>_>::vector
                                    (in_stack_fffffffffffff560,
                                     (vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff558);
                          sVar14 = std::vector<char,_std::allocator<char>_>::size(&local_4f0);
                          operator_new__(sVar14);
                          std::shared_ptr<unsigned_char[]>::shared_ptr<unsigned_char,void>
                                    ((shared_ptr<unsigned_char[]> *)in_stack_fffffffffffff510,
                                     (uchar *)in_stack_fffffffffffff508);
                          __dest = std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::
                                   get(&local_500);
                          __src = std::vector<char,_std::allocator<char>_>::operator[](&local_4f0,0)
                          ;
                          sVar14 = std::vector<char,_std::allocator<char>_>::size(&local_4f0);
                          memcpy(__dest,__src,sVar14);
                          Header::Header((Header *)in_stack_fffffffffffff510);
                          std::__cxx11::string::string(local_530);
                          std::vector<char,_std::allocator<char>_>::size(&local_4f0);
                          bVar1 = Header::parse((Header *)in_stack_fffffffffffff520,
                                                in_stack_fffffffffffff518,
                                                (uint32_t)((ulong)in_stack_fffffffffffff510 >> 0x20)
                                                ,(string *)in_stack_fffffffffffff508);
                          if (bVar1) {
                            if (((console::g_initialized ^ 0xff) & 1) != 0) {
                              console::initialize();
                            }
                            if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                  ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff550,
                                         (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                          in_stack_fffffffffffff548),
                                         (allocator<char> *)in_stack_fffffffffffff540);
                              console::initializeLogLocation
                                        ((LogLocation *)in_stack_fffffffffffff540,
                                         (string *)in_stack_fffffffffffff538,
                                         in_stack_fffffffffffff534);
                              std::__cxx11::string::~string(local_578);
                              std::allocator<char>::~allocator(&local_579);
                            }
                            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                ::loc.level_ != Debug) {
                              console::setLogLocationLevel
                                        ((LogLocation *)in_stack_fffffffffffff510,
                                         (Level)((ulong)in_stack_fffffffffffff508 >> 0x20));
                              console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                            }
                            uVar3 = in_stack_fffffffffffff614 & 0xffffff;
                            if ((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                 ::loc.logger_enabled_ & 1U) != 0) {
                              uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffff614);
                            }
                            local_57a = (char)(uVar3 >> 0x18);
                            if (local_57a != '\0') {
                              in_stack_fffffffffffff608 =
                                   (TransportPtr *)
                                   pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                   ::loc.logger_;
                              in_stack_fffffffffffff610 =
                                   pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                   ::loc.level_;
                              in_stack_fffffffffffff510 =
                                   (Subscription *)std::__cxx11::string::c_str();
                              uVar15 = (undefined4)((ulong)in_stack_fffffffffffff520 >> 0x20);
                              uVar8 = std::__cxx11::string::c_str();
                              in_stack_fffffffffffff520 = (LogLocation *)CONCAT44(uVar15,local_4cc);
                              in_stack_fffffffffffff508 =
                                   "Connecting via udpros to topic [%s] at host [%s:%d] connection id [%08x] max_datagram_size [%d]"
                              ;
                              in_stack_fffffffffffff528 = local_4d0;
                              in_stack_fffffffffffff530 = local_4d4;
                              pSVar18 = in_stack_fffffffffffff510;
                              console::print((FilterBase *)0x0,in_stack_fffffffffffff608,
                                             (Level)(ulong)in_stack_fffffffffffff610,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                             ,0x22f,
                                             "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                             ,
                                             "Connecting via udpros to topic [%s] at host [%s:%d] connection id [%08x] max_datagram_size [%d]"
                                             ,in_stack_fffffffffffff510,uVar8);
                              is_server = (undefined1)((ulong)pSVar18 >> 0x38);
                            }
                            std::__cxx11::string::string(local_5a0);
                            header_func = (HeaderReceivedFunc *)local_5c1;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff550,
                                       (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                        in_stack_fffffffffffff548),
                                       (allocator<char> *)in_stack_fffffffffffff540);
                            bVar1 = Header::getValue((Header *)in_stack_fffffffffffff538,
                                                     (string *)
                                                     CONCAT44(in_stack_fffffffffffff534,
                                                              in_stack_fffffffffffff530),
                                                     (string *)
                                                     CONCAT44(in_stack_fffffffffffff52c,
                                                              in_stack_fffffffffffff528));
                            std::__cxx11::string::~string((string *)(local_5c1 + 1));
                            std::allocator<char>::~allocator((allocator<char> *)local_5c1);
                            if (bVar1) {
                              if (((console::g_initialized ^ 0xff) & 1) != 0) {
                                console::initialize();
                              }
                              LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
                              if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                    ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffff550,
                                           (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                            in_stack_fffffffffffff548),
                                           (allocator<char> *)in_stack_fffffffffffff540);
                                console::initializeLogLocation
                                          ((LogLocation *)in_stack_fffffffffffff540,
                                           (string *)in_stack_fffffffffffff538,
                                           in_stack_fffffffffffff534);
                                std::__cxx11::string::~string(local_5e8);
                                std::allocator<char>::~allocator(&local_5e9);
                              }
                              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                  ::loc.level_ != Debug) {
                                console::setLogLocationLevel
                                          ((LogLocation *)in_stack_fffffffffffff510,LVar17);
                                console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                              }
                              pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                        ::loc.logger_;
                              LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                       ::loc.level_;
                              local_5ea = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                           ::loc.logger_enabled_ & 1U) != 0;
                              if ((bool)local_5ea) {
                                uVar8 = std::__cxx11::string::c_str();
                                uVar9 = std::__cxx11::string::c_str();
                                console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                               ,0x234,
                                               "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                               ,
                                               "Received error message in header for connection to [%s]: [%s]"
                                               ,uVar8,uVar9);
                              }
                              closeTransport((TransportUDPPtr *)0x4d5a51);
                              local_24 = 1;
                            }
                            else {
                              std::enable_shared_from_this<miniros::Subscription>::shared_from_this
                                        ((enable_shared_from_this<miniros::Subscription> *)
                                         in_stack_fffffffffffff508);
                              std::
                              make_shared<miniros::TransportPublisherLink,std::shared_ptr<miniros::Subscription>,std::__cxx11::string&,miniros::TransportHints&>
                                        ((shared_ptr<miniros::Subscription> *)
                                         CONCAT44(in_stack_fffffffffffff54c,
                                                  in_stack_fffffffffffff548),
                                         in_stack_fffffffffffff540,in_stack_fffffffffffff538);
                              std::shared_ptr<miniros::Subscription>::~shared_ptr
                                        ((shared_ptr<miniros::Subscription> *)0x4d5ab9);
                              std::
                              __shared_ptr_access<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x4d5ac6);
                              bVar1 = PublisherLink::setHeader
                                                ((PublisherLink *)
                                                 CONCAT17(in_stack_fffffffffffff6bf,
                                                          in_stack_fffffffffffff6b8),
                                                 (Header *)pXVar11);
                              if (bVar1) {
                                std::make_shared<miniros::Connection>();
                                std::
                                __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x4d5b0b);
                                std::shared_ptr<miniros::Transport>::
                                shared_ptr<miniros::TransportUDP,void>
                                          ((shared_ptr<miniros::Transport> *)
                                           in_stack_fffffffffffff510,
                                           (shared_ptr<miniros::TransportUDP> *)
                                           in_stack_fffffffffffff508);
                                std::
                                function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                                ::function((function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                                            *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
                                Connection::initialize
                                          ((Connection *)CONCAT44(uVar3,in_stack_fffffffffffff610),
                                           in_stack_fffffffffffff608,(bool)is_server,header_func);
                                std::
                                function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                                ::~function((function<bool_(const_std::shared_ptr<miniros::Connection>_&,_const_miniros::Header_&)>
                                             *)0x4d5b83);
                                std::shared_ptr<miniros::Transport>::~shared_ptr
                                          ((shared_ptr<miniros::Transport> *)0x4d5b90);
                                std::
                                __shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x4d5b9d);
                                Connection::setHeader
                                          ((Connection *)in_stack_fffffffffffff510,
                                           (Header *)in_stack_fffffffffffff508);
                                std::
                                __shared_ptr_access<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<miniros::TransportPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x4d5bbc);
                                TransportPublisherLink::initialize
                                          (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
                                ConnectionManager::instance();
                                std::
                                __shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x4d5bea);
                                ConnectionManager::addConnection
                                          (in_stack_fffffffffffff550,
                                           (ConnectionPtr *)
                                           CONCAT44(in_stack_fffffffffffff54c,
                                                    in_stack_fffffffffffff548));
                                std::scoped_lock<std::mutex>::scoped_lock
                                          ((scoped_lock<std::mutex> *)in_stack_fffffffffffff510,
                                           (mutex_type *)in_stack_fffffffffffff508);
                                std::shared_ptr<miniros::PublisherLink>::
                                shared_ptr<miniros::TransportPublisherLink,void>
                                          ((shared_ptr<miniros::PublisherLink> *)
                                           in_stack_fffffffffffff510,
                                           (shared_ptr<miniros::TransportPublisherLink> *)
                                           in_stack_fffffffffffff508);
                                addPublisherLink(in_stack_fffffffffffff510,
                                                 (PublisherLinkPtr *)in_stack_fffffffffffff508);
                                LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
                                std::shared_ptr<miniros::PublisherLink>::~shared_ptr
                                          ((shared_ptr<miniros::PublisherLink> *)0x4d5c5b);
                                if (((console::g_initialized ^ 0xff) & 1) != 0) {
                                  console::initialize();
                                }
                                if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                      ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff550,
                                             (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                              in_stack_fffffffffffff548),
                                             (allocator<char> *)in_stack_fffffffffffff540);
                                  console::initializeLogLocation
                                            ((LogLocation *)in_stack_fffffffffffff540,
                                             (string *)in_stack_fffffffffffff538,
                                             in_stack_fffffffffffff534);
                                  std::__cxx11::string::~string(local_688);
                                  std::allocator<char>::~allocator(&local_689);
                                }
                                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                    ::loc.level_ != Debug) {
                                  console::setLogLocationLevel
                                            ((LogLocation *)in_stack_fffffffffffff510,LVar17);
                                  console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                                }
                                pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                          ::loc.logger_;
                                LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                         ::loc.level_;
                                local_68a = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                             ::loc.logger_enabled_ & 1U) != 0;
                                if ((bool)local_68a) {
                                  uVar8 = std::__cxx11::string::c_str();
                                  uVar15 = (undefined4)((ulong)in_stack_fffffffffffff520 >> 0x20);
                                  uVar9 = std::__cxx11::string::c_str();
                                  in_stack_fffffffffffff520 =
                                       (LogLocation *)CONCAT44(uVar15,local_4cc);
                                  console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                                 ,0x246,
                                                 "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                                 ,"Connected to publisher of topic [%s] at [%s:%d]",
                                                 uVar8,uVar9);
                                }
                                std::scoped_lock<std::mutex>::~scoped_lock
                                          ((scoped_lock<std::mutex> *)0x4d5f13);
                                std::shared_ptr<miniros::Connection>::~shared_ptr
                                          ((shared_ptr<miniros::Connection> *)0x4d5f20);
                                local_24 = 0;
                              }
                              else {
                                if (((console::g_initialized ^ 0xff) & 1) != 0) {
                                  console::initialize();
                                }
                                LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
                                if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                      ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff550,
                                             (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                              in_stack_fffffffffffff548),
                                             (allocator<char> *)in_stack_fffffffffffff540);
                                  console::initializeLogLocation
                                            ((LogLocation *)in_stack_fffffffffffff540,
                                             (string *)in_stack_fffffffffffff538,
                                             in_stack_fffffffffffff534);
                                  std::__cxx11::string::~string(local_6b0);
                                  std::allocator<char>::~allocator(&local_6b1);
                                }
                                if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                    ::loc.level_ != Debug) {
                                  console::setLogLocationLevel
                                            ((LogLocation *)in_stack_fffffffffffff510,LVar17);
                                  console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                                }
                                LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                         ::loc.level_;
                                local_6b2 = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                             ::loc.logger_enabled_ & 1U) != 0;
                                if ((bool)local_6b2) {
                                  pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                            ::loc.logger_;
                                  uVar8 = std::__cxx11::string::c_str();
                                  uVar15 = (undefined4)((ulong)in_stack_fffffffffffff520 >> 0x20);
                                  uVar9 = std::__cxx11::string::c_str();
                                  in_stack_fffffffffffff520 =
                                       (LogLocation *)CONCAT44(uVar15,local_4cc);
                                  console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                                 ,0x24a,
                                                 "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                                 ,
                                                 "Failed to connect to publisher of topic [%s] at [%s:%d]"
                                                 ,uVar8,uVar9);
                                }
                                closeTransport((TransportUDPPtr *)0x4d6119);
                                local_24 = 1;
                              }
                              std::shared_ptr<miniros::TransportPublisherLink>::~shared_ptr
                                        ((shared_ptr<miniros::TransportPublisherLink> *)0x4d6140);
                            }
                            std::__cxx11::string::~string(local_5a0);
                          }
                          else {
                            if (((console::g_initialized ^ 0xff) & 1) != 0) {
                              console::initialize();
                            }
                            LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
                            if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                  ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff550,
                                         (char *)CONCAT44(in_stack_fffffffffffff54c,
                                                          in_stack_fffffffffffff548),
                                         (allocator<char> *)in_stack_fffffffffffff540);
                              console::initializeLogLocation
                                        ((LogLocation *)in_stack_fffffffffffff540,
                                         (string *)in_stack_fffffffffffff538,
                                         in_stack_fffffffffffff534);
                              std::__cxx11::string::~string(local_550);
                              std::allocator<char>::~allocator(&local_551);
                            }
                            if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                ::loc.level_ != Debug) {
                              console::setLogLocationLevel
                                        ((LogLocation *)in_stack_fffffffffffff510,LVar17);
                              console::checkLogLocationEnabled(in_stack_fffffffffffff520);
                            }
                            pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                      ::loc.logger_;
                            LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                     ::loc.level_;
                            local_552 = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                         ::loc.logger_enabled_ & 1U) != 0;
                            if ((bool)local_552) {
                              uVar8 = std::__cxx11::string::c_str();
                              console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                                             ,0x22b,
                                             "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                                             ,"Unable to parse UDPROS connection header: %s",uVar8);
                            }
                            closeTransport((TransportUDPPtr *)0x4d5566);
                            local_24 = 1;
                          }
                          std::__cxx11::string::~string(local_530);
                          Header::~Header((Header *)0x4d6167);
                          std::shared_ptr<unsigned_char[]>::~shared_ptr
                                    ((shared_ptr<unsigned_char[]> *)0x4d6174);
                          std::vector<char,_std::allocator<char>_>::~vector
                                    ((vector<char,_std::allocator<char>_> *)
                                     in_stack_fffffffffffff520);
                          std::__cxx11::string::~string(local_4c8);
                          if (local_24 == 0) goto LAB_004d63a1;
                          goto LAB_004d63ac;
                        }
                      }
                    }
                  }
                }
              }
              LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
              if (((console::g_initialized ^ 0xff) & 1) != 0) {
                console::initialize();
              }
              if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff550,
                           (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                           (allocator<char> *)in_stack_fffffffffffff540);
                console::initializeLogLocation
                          ((LogLocation *)in_stack_fffffffffffff540,
                           (string *)in_stack_fffffffffffff538,in_stack_fffffffffffff534);
                std::__cxx11::string::~string(local_4a0);
                std::allocator<char>::~allocator(&local_4a1);
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.level_ != Debug) {
                console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
                console::checkLogLocationEnabled(in_stack_fffffffffffff520);
              }
              local_4a2 = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.logger_enabled_ & 1U) != 0;
              if ((bool)local_4a2) {
                console::print((FilterBase *)0x0,
                               pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                               ::loc.logger_,
                               (Level)(ulong)pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                             ::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                               ,0x21c,
                               "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                               ,
                               "publisher implements UDPROS, but the parameters aren\'t string,int,int,int,base64"
                              );
              }
              closeTransport((TransportUDPPtr *)0x4d50d4);
              local_24 = 1;
            }
            else {
              if (((console::g_initialized ^ 0xff) & 1) != 0) {
                console::initialize();
              }
              LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
              if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                    ::loc.initialized_ ^ 0xffU) & 1) != 0) {
                this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_6d9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (this_03,(char *)CONCAT44(in_stack_fffffffffffff54c,
                                                    in_stack_fffffffffffff548),
                           (allocator<char> *)in_stack_fffffffffffff540);
                console::initializeLogLocation
                          ((LogLocation *)in_stack_fffffffffffff540,
                           (string *)in_stack_fffffffffffff538,in_stack_fffffffffffff534);
                std::__cxx11::string::~string((string *)(local_6d9 + 1));
                std::allocator<char>::~allocator((allocator<char> *)local_6d9);
              }
              if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.level_ != Debug) {
                console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
                console::checkLogLocationEnabled(in_stack_fffffffffffff520);
              }
              if ((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                   ::loc.logger_enabled_ & 1U) != 0) {
                pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                          ::loc.logger_;
                LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                         ::loc.level_;
                uVar8 = std::__cxx11::string::c_str();
                console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                               ,0x251,
                               "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                               ,"Publisher offered unsupported transport [%s]",uVar8);
              }
LAB_004d63a1:
              local_24 = 0;
            }
          }
LAB_004d63ac:
          std::__cxx11::string::~string(local_328);
        }
        else {
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
          if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ ^ 0xffU) & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff550,
                       (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                       (allocator<char> *)in_stack_fffffffffffff540);
            console::initializeLogLocation
                      ((LogLocation *)in_stack_fffffffffffff540,(string *)in_stack_fffffffffffff538,
                       in_stack_fffffffffffff534);
            std::__cxx11::string::~string(local_300);
            std::allocator<char>::~allocator(&local_301);
          }
          if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.level_ != Debug) {
            console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
            console::checkLogLocationEnabled(in_stack_fffffffffffff520);
          }
          local_302 = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                       ::loc.logger_enabled_ & 1U) != 0;
          if ((bool)local_302) {
            console::print((FilterBase *)0x0,
                           pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                           ::loc.logger_,
                           (Level)(ulong)pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                                         ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                           ,0x1e9,
                           "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                           ,
                           "Available protocol info list doesn\'t have a string as its first element."
                          );
          }
          closeTransport((TransportUDPPtr *)0x4d40c3);
          local_24 = 1;
        }
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
        if (((pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
              ::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff550,
                     (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                     (allocator<char> *)in_stack_fffffffffffff540);
          console::initializeLogLocation
                    ((LogLocation *)in_stack_fffffffffffff540,(string *)in_stack_fffffffffffff538,
                     in_stack_fffffffffffff534);
          std::__cxx11::string::~string(local_2d8);
          std::allocator<char>::~allocator(&local_2d9);
        }
        if (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
          console::checkLogLocationEnabled(in_stack_fffffffffffff520);
        }
        pvVar16 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                  ::loc.logger_;
        LVar17 = pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                 ::loc.level_;
        local_2da = (pendingConnectionDone(std::shared_ptr<miniros::Subscription::PendingConnection>const&,XmlRpc::XmlRpcValue&)
                     ::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_2da) {
          uVar8 = std::__cxx11::string::c_str();
          console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                         ,0x1e3,
                         "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                         ,"Available protocol info returned from %s is not a list.",uVar8);
        }
        closeTransport((TransportUDPPtr *)0x4d3ee1);
        local_24 = 1;
      }
    }
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffff518 >> 0x20);
    LVar17 = (Level)((ulong)in_stack_fffffffffffff508 >> 0x20);
    if (((pendingConnectionDone::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff550,
                 (char *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                 (allocator<char> *)in_stack_fffffffffffff540);
      console::initializeLogLocation
                ((LogLocation *)in_stack_fffffffffffff540,(string *)in_stack_fffffffffffff538,
                 in_stack_fffffffffffff534);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator(&local_289);
    }
    if (pendingConnectionDone::loc.level_ != Debug) {
      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffff510,LVar17);
      console::checkLogLocationEnabled(in_stack_fffffffffffff520);
    }
    pvVar16 = pendingConnectionDone::loc.logger_;
    LVar17 = pendingConnectionDone::loc.level_;
    local_28a = (pendingConnectionDone::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_28a) {
      uVar8 = std::__cxx11::string::c_str();
      uVar3 = local_74;
      uVar9 = std::__cxx11::string::c_str();
      console::print((FilterBase *)0x0,pvVar16,(Level)(ulong)LVar17,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0x1d5,
                     "void miniros::Subscription::pendingConnectionDone(const PendingConnectionPtr &, XmlRpcValue &)"
                     ,"Failed to contact publisher [%s:%d] for topic [%s]",uVar8,
                     CONCAT44(uVar15,uVar3),uVar9);
    }
    closeTransport((TransportUDPPtr *)0x4d3ac4);
    local_24 = 1;
  }
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d63c6);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::stringstream::~stringstream(local_200);
  std::__cxx11::string::~string(local_70);
  std::shared_ptr<miniros::TransportUDP>::~shared_ptr((shared_ptr<miniros::TransportUDP> *)0x4d63fa)
  ;
LAB_004d63fa:
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d6407);
  return;
}

Assistant:

void Subscription::pendingConnectionDone(const PendingConnectionPtr& conn, XmlRpcValue& result)
{
  std::scoped_lock<std::mutex> lock(shutdown_mutex_);
  if (shutting_down_ || dropped_)
  {
    return;
  }

  {
    std::scoped_lock<std::mutex> pending_connections_lock(pending_connections_mutex_);
    pending_connections_.erase(conn);
  }

  TransportUDPPtr udp_transport;

  std::string peer_host = conn->getClient()->getHost();
  uint32_t peer_port = conn->getClient()->getPort();
  std::stringstream ss;
  ss << "http://" << peer_host << ":" << peer_port << "/";
  std::string xmlrpc_uri = ss.str();
  udp_transport = conn->getUDPTransport();

  XmlRpc::XmlRpcValue proto;
  if(!RPCManager::instance()->validateXmlrpcResponse("requestTopic", result, proto))
  {
  	MINIROS_DEBUG("Failed to contact publisher [%s:%d] for topic [%s]",
              peer_host.c_str(), peer_port, name_.c_str());
  	closeTransport(udp_transport);
  	return;
  }

  if (proto.size() == 0)
  {
  	MINIROS_DEBUG("Couldn't agree on any common protocols with [%s] for topic [%s]", xmlrpc_uri.c_str(), name_.c_str());
  	closeTransport(udp_transport);
  	return;
  }

  if (proto.getType() != XmlRpcValue::TypeArray)
  {
  	MINIROS_DEBUG("Available protocol info returned from %s is not a list.", xmlrpc_uri.c_str());
  	closeTransport(udp_transport);
  	return;
  }
  if (proto[0].getType() != XmlRpcValue::TypeString)
  {
  	MINIROS_DEBUG("Available protocol info list doesn't have a string as its first element.");
  	closeTransport(udp_transport);
  	return;
  }

  std::string proto_name = proto[0];
  if (proto_name == "TCPROS")
  {
    if (proto.size() != 3 ||
        proto[1].getType() != XmlRpcValue::TypeString ||
        proto[2].getType() != XmlRpcValue::TypeInt)
    {
        MINIROS_DEBUG("publisher implements TCPROS, but the " \
                "parameters aren't string,int");
      return;
    }
    std::string pub_host = proto[1];
    int pub_port = proto[2];
    MINIROS_DEBUG("Connecting via tcpros to topic [%s] at host [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);

    TransportTCPPtr transport(std::make_shared<TransportTCP>(&PollManager::instance()->getPollSet()));
    if (transport->connect(pub_host, pub_port))
    {
      ConnectionPtr connection(std::make_shared<Connection>());
      TransportPublisherLinkPtr pub_link(std::make_shared<TransportPublisherLink>(shared_from_this(), xmlrpc_uri, transport_hints_));

      connection->initialize(transport, false, HeaderReceivedFunc());
      pub_link->initialize(connection);

      ConnectionManager::instance()->addConnection(connection);

      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      addPublisherLink(pub_link);

      MINIROS_DEBUG("Connected to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
    else
    {
      MINIROS_DEBUG("Failed to connect to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
  }
  else if (proto_name == "UDPROS")
  {
    if (proto.size() != 6 ||
        proto[1].getType() != XmlRpcValue::TypeString ||
        proto[2].getType() != XmlRpcValue::TypeInt ||
        proto[3].getType() != XmlRpcValue::TypeInt ||
        proto[4].getType() != XmlRpcValue::TypeInt ||
        proto[5].getType() != XmlRpcValue::TypeBase64)
    {
      MINIROS_DEBUG("publisher implements UDPROS, but the " \
	    	       "parameters aren't string,int,int,int,base64");
      closeTransport(udp_transport);
      return;
    }
    std::string pub_host = proto[1];
    int pub_port = proto[2];
    int conn_id = proto[3];
    int max_datagram_size = proto[4];
    std::vector<char> header_bytes = proto[5];
    std::shared_ptr<uint8_t[]> buffer(new uint8_t[header_bytes.size()]);
    memcpy(buffer.get(), &header_bytes[0], header_bytes.size());
    Header h;
    std::string err;
    if (!h.parse(buffer, header_bytes.size(), err))
    {
      MINIROS_DEBUG("Unable to parse UDPROS connection header: %s", err.c_str());
      closeTransport(udp_transport);
      return;
    }
    MINIROS_DEBUG("Connecting via udpros to topic [%s] at host [%s:%d] connection id [%08x] max_datagram_size [%d]", name_.c_str(), pub_host.c_str(), pub_port, conn_id, max_datagram_size);

    std::string error_msg;
    if (h.getValue("error", error_msg))
    {
      MINIROS_DEBUG("Received error message in header for connection to [%s]: [%s]", xmlrpc_uri.c_str(), error_msg.c_str());
      closeTransport(udp_transport);
      return;
    }

    TransportPublisherLinkPtr pub_link(std::make_shared<TransportPublisherLink>(shared_from_this(), xmlrpc_uri, transport_hints_));
    if (pub_link->setHeader(h))
    {
      ConnectionPtr connection(std::make_shared<Connection>());
      connection->initialize(udp_transport, false, NULL);
      connection->setHeader(h);
      pub_link->initialize(connection);

      ConnectionManager::instance()->addConnection(connection);

      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
      addPublisherLink(pub_link);

      MINIROS_DEBUG("Connected to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
    }
    else
    {
      MINIROS_DEBUG("Failed to connect to publisher of topic [%s] at [%s:%d]", name_.c_str(), pub_host.c_str(), pub_port);
      closeTransport(udp_transport);
      return;
    }
  }
  else
  {
  	MINIROS_DEBUG("Publisher offered unsupported transport [%s]", proto_name.c_str());
  }
}